

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_kmeth.c
# Opt level: O2

int SM2_compute_pubkey_bn(BIGNUM *privkey_bn,BIGNUM *pubkey_x_bn,BIGNUM *pubkey_y_bn)

{
  int iVar1;
  EC_GROUP *group;
  BN_CTX *ctx;
  EC_POINT *r;
  uint uVar2;
  undefined1 auVar3 [16];
  
  group = SM2_get_group();
  auVar3._0_4_ = -(uint)(privkey_bn == (BIGNUM *)0x0);
  auVar3._4_4_ = -(uint)((int)group == 0 && (int)((ulong)group >> 0x20) == 0);
  auVar3._8_4_ = -(uint)(pubkey_x_bn == (BIGNUM *)0x0);
  auVar3._12_4_ = -(uint)(pubkey_y_bn == (BIGNUM *)0x0);
  iVar1 = movmskps((int)group,auVar3);
  if (iVar1 == 0) {
    ctx = BN_CTX_new();
    r = EC_POINT_new((EC_GROUP *)group);
    if (ctx != (BN_CTX *)0x0 && r != (EC_POINT *)0x0) {
      iVar1 = EC_POINT_mul((EC_GROUP *)group,r,(BIGNUM *)privkey_bn,(EC_POINT *)0x0,(BIGNUM *)0x0,
                           ctx);
      if (iVar1 != 0) {
        iVar1 = EC_POINT_get_affine_coordinates_GFp
                          ((EC_GROUP *)group,r,(BIGNUM *)pubkey_x_bn,(BIGNUM *)pubkey_y_bn,ctx);
        uVar2 = (uint)(iVar1 != 0);
        goto LAB_0011d669;
      }
    }
  }
  else {
    ctx = (BN_CTX *)0x0;
    r = (EC_POINT *)0x0;
  }
  uVar2 = 0;
LAB_0011d669:
  BN_CTX_free(ctx);
  EC_POINT_free(r);
  return uVar2;
}

Assistant:

int SM2_compute_pubkey_bn(BIGNUM *privkey_bn, BIGNUM *pubkey_x_bn, BIGNUM *pubkey_y_bn)
{
    int ret = GML_ERROR;
    BN_CTX *ctx = NULL;
    EC_POINT *point = NULL;
    const EC_GROUP *group = NULL;

    group = SM2_get_group();
    if (group == NULL || privkey_bn == NULL || pubkey_x_bn == NULL || pubkey_y_bn == NULL)
        goto end;

    ctx = BN_CTX_new();
    point = EC_POINT_new(group);
    if (point == NULL || ctx == NULL)
        goto end;

    /* compute public key : point = k * G */
    if (EC_POINT_mul(group, point, privkey_bn, NULL, NULL, ctx) == GML_ERROR) 
        goto end;

    if (EC_POINT_get_affine_coordinates_GFp(group, point, pubkey_x_bn, pubkey_y_bn, ctx) == GML_ERROR) 
        goto end;

    ret = GML_OK;
end:
    BN_CTX_free(ctx);
    EC_POINT_free(point);
    return ret;
}